

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O1

void __thiscall psy::C::ParserTester::case0053(ParserTester *this)

{
  string text;
  Expectation X;
  ParseOptions parseOpts;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined1 in_stack_fffffffffffffe08 [16];
  pointer in_stack_fffffffffffffe18;
  pointer in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffe38;
  long in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48 [14];
  undefined8 uVar3;
  undefined2 uVar4;
  undefined8 in_stack_fffffffffffffe60;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe68;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe80 [64];
  _Alloc_hider in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  pointer local_118;
  pointer local_108;
  vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> local_100;
  pointer local_e0;
  pointer local_d0;
  Expectation local_c8;
  
  puVar2 = &stack0xfffffffffffffe40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe30,"_Complex _Complex x ;","");
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe80);
  uVar3 = 0x401040103ee03e8;
  uVar4 = 0x412;
  __l._M_len = 5;
  __l._M_array = (iterator)&stack0xfffffffffffffe56;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe18,__l,(allocator_type *)&stack0xfffffffffffffe17);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe80,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffe18);
  Expectation::Expectation(&local_c8,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe60);
  text._M_string_length = in_stack_fffffffffffffe68.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe60;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe70.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe78;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe18;
  X.numE_ = in_stack_fffffffffffffe08._0_4_;
  X.numW_ = in_stack_fffffffffffffe08._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe08._8_8_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe20;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe28;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe38;
  X.continueTestDespiteOfErrors_ = (bool)(char)in_stack_fffffffffffffe40;
  X.containsAmbiguity_ = (bool)(char)((ulong)in_stack_fffffffffffffe40 >> 8);
  X._58_6_ = (int6)((ulong)in_stack_fffffffffffffe40 >> 0x10);
  X.ambiguityText_._0_14_ = in_stack_fffffffffffffe48;
  X.ambiguityText_._14_8_ = uVar3;
  X.ambiguityText_.field_2._M_allocated_capacity._6_2_ = uVar4;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe60;
  X._96_8_ = in_stack_fffffffffffffe68.BF_all_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe70.BF_all_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe78;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe80._0_8_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe80._8_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe80[0x20];
  X._153_7_ = in_stack_fffffffffffffe80._33_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data =
       (_Vector_base<int,_std::allocator<int>_>)
       (_Vector_base<int,_std::allocator<int>_>)in_stack_fffffffffffffe80._40_24_;
  parseOpts.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)in_stack_fffffffffffffec8;
  parseOpts._0_8_ = in_stack_fffffffffffffec0._M_p;
  parseOpts.langExts_.field_1 =
       (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)in_stack_fffffffffffffed0;
  parseOpts._24_8_ = in_stack_fffffffffffffed8;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe30,parseOpts);
  if (local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_c8.declarations_);
  if (local_c8.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.ambiguityText_._M_dataplus._M_p != &local_c8.ambiguityText_.field_2) {
    operator_delete(local_c8.ambiguityText_._M_dataplus._M_p,
                    local_c8.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.descriptorsE_);
  if (in_stack_fffffffffffffe18 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffe18,
                    (long)in_stack_fffffffffffffe28 - (long)in_stack_fffffffffffffe18);
  }
  if (local_e0 != (pointer)0x0) {
    operator_delete(local_e0,(long)local_d0 - (long)local_e0);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_100);
  if (local_118 != (pointer)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  if (in_stack_fffffffffffffec0._M_p != &stack0xfffffffffffffed0) {
    operator_delete(in_stack_fffffffffffffec0._M_p,in_stack_fffffffffffffed0 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffea0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe88);
  if (puVar2 != &stack0xfffffffffffffe40) {
    operator_delete(puVar2,in_stack_fffffffffffffe40 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0053()
{
    // Not a syntactic error, but a semantic one; covered in:
    CROSS_REFERENCE_TEST(DeclarationBinderTester::case0018);

    parse("_Complex _Complex x ;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::VariableAndOrFunctionDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator }));
}